

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O3

QTextTableCell adjacentCell(QTextTable *table,QTextTableCell *cell,Edge edge)

{
  ulong in_RCX;
  undefined4 in_register_00000014;
  QTextTableCell QVar1;
  
  QVar1 = (QTextTableCell)
          (*(code *)(&DAT_006ac4e0 + *(int *)(&DAT_006ac4e0 + (in_RCX & 0xffffffff) * 4)))
                    (table,cell,CONCAT44(in_register_00000014,edge));
  return QVar1;
}

Assistant:

static inline QTextTableCell adjacentCell(QTextTable *table, const QTextTableCell &cell,
                                          QCss::Edge edge)
{
    int dc = 0;
    int dr = 0;

    switch (edge) {
    case QCss::LeftEdge:
        dc = -1;
        break;
    case QCss::RightEdge:
        dc = cell.columnSpan();
        break;
    case QCss::TopEdge:
        dr = -1;
        break;
    case QCss::BottomEdge:
        dr = cell.rowSpan();
        break;
    default:
        Q_UNREACHABLE();
        break;
    }

    // get sibling cell
    int col = cell.column() + dc;
    int row = cell.row() + dr;

    if (col < 0 || row < 0 || col >= table->columns() || row >= table->rows())
        return QTextTableCell();
    else
        return table->cellAt(cell.row() + dr, cell.column() + dc);
}